

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

void __thiscall slang::ast::PulseStyleSymbol::resolve(PulseStyleSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  Scope *parentParent;
  LookupLocation LVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar4;
  ASTContext context;
  ASTContext local_58;
  
  this->isResolved = true;
  pSVar1 = (this->super_Symbol).parentScope;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  parentParent = pSVar1->thisSym->parentScope;
  LVar3 = LookupLocation::after(&this->super_Symbol);
  local_58.lookupIndex = LVar3.index;
  local_58.flags.m_bits = 0x400000020;
  local_58.instanceOrProc = (Symbol *)0x0;
  local_58.firstTempVar = (TempVarSymbol *)0x0;
  local_58.randomizeDetails = (RandomizeDetails *)0x0;
  local_58.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_58.scope.ptr = pSVar1;
  sVar4 = bindTerminals((SeparatedSyntaxList<slang::syntax::NameSyntax> *)(pSVar2 + 4),Output,
                        parentParent,&local_58);
  this->terminals = sVar4;
  return;
}

Assistant:

void PulseStyleSymbol::resolve() const {
    isResolved = true;

    auto syntaxPtr = getSyntax();
    auto parent = getParentScope();
    SLANG_ASSERT(syntaxPtr && parent);

    auto parentParent = parent->asSymbol().getParentScope();
    ASTContext context(*parent, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::SpecifyBlock);

    auto& syntax = syntaxPtr->as<PulseStyleDeclarationSyntax>();
    terminals = bindTerminals(syntax.inputs, SpecifyBlockSymbol::SpecifyTerminalDir::Output,
                              parentParent, context);
}